

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.c
# Opt level: O3

void sig_err_handler(int sig)

{
  pid_t pVar1;
  __pid_t _Var2;
  ulong in_RAX;
  tester_list *ptVar3;
  pid_list_item *ppVar4;
  undefined8 uStack_28;
  _Bool ignored_err;
  
  pVar1 = main_pid;
  uStack_28 = in_RAX & 0xffffffffffffff;
  _Var2 = getpid();
  ptVar3 = tester_data;
  if (pVar1 == _Var2) {
    for (; ppVar4 = children, ptVar3 != (tester_list_t *)0x0; ptVar3 = ptVar3->next) {
      if (ptVar3->this != (tester_t *)0x0) {
        kill(ptVar3->this->pid,0xf);
      }
    }
    for (; ppVar4 != (pid_list_item_t *)0x0; ppVar4 = ppVar4->next) {
      if (ppVar4->pid != -1) {
        kill(ppVar4->pid,0xf);
      }
    }
  }
  validator_mq_finish(pVar1 == _Var2,validator_mq,(_Bool *)((long)&uStack_28 + 7));
  tester_mq_finish(false,current_tester_mq,(char *)0x0,(_Bool *)((long)&uStack_28 + 7));
  exit(1);
}

Assistant:

static void sig_err_handler(int sig) {
    UNUSED(sig);

    bool ignored_err = false;
    if(main_pid == getpid()) {
        for(tester_list_t *iter = tester_data; iter != NULL; iter = iter->next) {
            if(iter->this != NULL) {
                kill(iter->this->pid, SIGTERM);
            }
        }
        for(pid_list_item_t *iter = children; iter != NULL; iter = iter->next) {
            if(iter->pid != PID_LIST_EMPTY_ITEM_PID) {
                kill(iter->pid, SIGTERM);
            }
        }
        validator_mq_finish(true, validator_mq, &ignored_err);
    } else {
        validator_mq_finish(false, validator_mq, &ignored_err);
    }
    tester_mq_finish(false, current_tester_mq, NULL, &ignored_err);
    // free is not a safe async function => have to rely on system to clean the list's dynamic memory
    exit(EXIT_FAILURE);
}